

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall spv::Function::~Function(Function *this)

{
  pointer ppIVar1;
  pointer ppBVar2;
  long lVar3;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_001f8d68;
  ppIVar1 = (this->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->parameterInstructions).
                              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3)) {
    lVar3 = 0;
    do {
      if (ppIVar1[lVar3] != (Instruction *)0x0) {
        (*ppIVar1[lVar3]->_vptr_Instruction[1])();
      }
      lVar3 = lVar3 + 1;
      ppIVar1 = (this->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(this->parameterInstructions).
                                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1)
                          >> 3));
  }
  ppBVar2 = (this->blocks).
            super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->blocks).
                              super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2) >> 3)) {
    lVar3 = 0;
    do {
      if (ppBVar2[lVar3] != (Block *)0x0) {
        (*ppBVar2[lVar3]->_vptr_Block[1])();
      }
      lVar3 = lVar3 + 1;
      ppBVar2 = (this->blocks).
                super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(this->blocks).
                                         super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2)
                          >> 3));
  }
  std::_Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::~_Vector_base
            (&(this->blocks).
              super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>);
  std::_Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
  ~_Vector_base(&(this->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               );
  (this->functionInstruction)._vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&(this->functionInstruction).operands.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  return;
}

Assistant:

virtual ~Function()
    {
        for (int i = 0; i < (int)parameterInstructions.size(); ++i)
            delete parameterInstructions[i];

        for (int i = 0; i < (int)blocks.size(); ++i)
            delete blocks[i];
    }